

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter_inl.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_option_opts_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt)

{
  _Base_ptr *pp_Var1;
  _Rb_tree_header *p_Var2;
  pointer pcVar3;
  Option *pOVar4;
  undefined8 uVar5;
  size_t sVar6;
  ostream *poVar7;
  _Base_ptr p_Var8;
  stringstream out;
  _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
  local_2c0;
  FormatterBase *local_290;
  string local_288;
  Option *local_268;
  string *local_260;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if ((opt->option_text_)._M_string_length == 0) {
    local_290 = &this->super_FormatterBase;
    if (opt->type_size_min_ != 0) {
      Option::get_type_name_abi_cxx11_((string *)&local_2c0,opt);
      uVar5 = local_2c0._M_impl.super__Rb_tree_header._M_header._0_8_;
      pp_Var1 = &local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent;
      if ((_Base_ptr *)local_2c0._M_impl._0_8_ != pp_Var1) {
        operator_delete((void *)local_2c0._M_impl._0_8_);
      }
      if (uVar5 != 0) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
        Option::get_type_name_abi_cxx11_(&local_1d8,opt);
        FormatterBase::get_label((string *)&local_2c0,local_290,&local_1d8);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,(char *)local_2c0._M_impl._0_8_,
                   local_2c0._M_impl.super__Rb_tree_header._M_header._0_8_);
        if ((_Base_ptr *)local_2c0._M_impl._0_8_ != pp_Var1) {
          operator_delete((void *)local_2c0._M_impl._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p);
        }
      }
      pcVar3 = (opt->default_str_)._M_dataplus._M_p;
      local_2c0._M_impl._0_8_ = pp_Var1;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c0,pcVar3,pcVar3 + (opt->default_str_)._M_string_length);
      uVar5 = local_2c0._M_impl.super__Rb_tree_header._M_header._0_8_;
      if ((_Base_ptr *)local_2c0._M_impl._0_8_ != pp_Var1) {
        operator_delete((void *)local_2c0._M_impl._0_8_);
      }
      if (uVar5 != 0) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," [",2);
        pcVar3 = (opt->default_str_)._M_dataplus._M_p;
        local_2c0._M_impl._0_8_ = pp_Var1;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2c0,pcVar3,pcVar3 + (opt->default_str_)._M_string_length);
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(char *)local_2c0._M_impl._0_8_,
                            local_2c0._M_impl.super__Rb_tree_header._M_header._0_8_);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] ",2);
        if ((_Base_ptr *)local_2c0._M_impl._0_8_ != pp_Var1) {
          operator_delete((void *)local_2c0._M_impl._0_8_);
        }
      }
      if (opt->expected_max_ == 0x20000000) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ...",4);
      }
      else if (1 < opt->expected_min_) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," x ",3);
        ::std::ostream::operator<<((ostream *)local_1a8,opt->expected_min_);
      }
      if ((opt->super_OptionBase<CLI::Option>).required_ == true) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"REQUIRED","");
        FormatterBase::get_label((string *)&local_2c0,local_290,&local_1f8);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,(char *)local_2c0._M_impl._0_8_,
                   local_2c0._M_impl.super__Rb_tree_header._M_header._0_8_);
        if ((_Base_ptr *)local_2c0._M_impl._0_8_ != pp_Var1) {
          operator_delete((void *)local_2c0._M_impl._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p);
        }
      }
    }
    pp_Var1 = &local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent;
    pcVar3 = (opt->envname_)._M_dataplus._M_p;
    local_2c0._M_impl._0_8_ = pp_Var1;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c0,pcVar3,pcVar3 + (opt->envname_)._M_string_length);
    uVar5 = local_2c0._M_impl.super__Rb_tree_header._M_header._0_8_;
    if ((_Base_ptr *)local_2c0._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)local_2c0._M_impl._0_8_);
    }
    local_268 = opt;
    if (uVar5 != 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," (",2);
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Env","");
      FormatterBase::get_label((string *)&local_2c0,local_290,&local_218);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_2c0._M_impl._0_8_,
                          local_2c0._M_impl.super__Rb_tree_header._M_header._0_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
      pcVar3 = (local_268->envname_)._M_dataplus._M_p;
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_288,pcVar3,pcVar3 + (local_268->envname_)._M_string_length);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_288._M_dataplus._M_p,local_288._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p);
      }
      opt = local_268;
      if ((_Base_ptr *)local_2c0._M_impl._0_8_ != pp_Var1) {
        operator_delete((void *)local_2c0._M_impl._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p);
      }
    }
    std::
    _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
    ::_Rb_tree(&local_2c0,&(opt->needs_)._M_t);
    sVar6 = local_2c0._M_impl.super__Rb_tree_header._M_node_count;
    std::
    _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
    ::~_Rb_tree(&local_2c0);
    local_260 = __return_storage_ptr__;
    if (sVar6 != 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Needs","");
      FormatterBase::get_label((string *)&local_2c0,local_290,&local_238);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_2c0._M_impl._0_8_,
                          local_2c0._M_impl.super__Rb_tree_header._M_header._0_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
      if ((_Base_ptr *)local_2c0._M_impl._0_8_ !=
          &local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)local_2c0._M_impl._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      std::
      _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
      ::_Rb_tree(&local_2c0,&(opt->needs_)._M_t);
      p_Var2 = &local_2c0._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)local_2c0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
        p_Var8 = local_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          pOVar4 = *(Option **)(p_Var8 + 1);
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
          Option::get_name_abi_cxx11_(&local_288,pOVar4,false,false);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_288._M_dataplus._M_p,local_288._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p);
          }
          p_Var8 = (_Base_ptr)::std::_Rb_tree_increment(p_Var8);
        } while ((_Rb_tree_header *)p_Var8 != p_Var2);
      }
      std::
      _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
      ::~_Rb_tree(&local_2c0);
      opt = local_268;
    }
    __return_storage_ptr__ = local_260;
    std::
    _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
    ::_Rb_tree(&local_2c0,&(opt->excludes_)._M_t);
    std::
    _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
    ::~_Rb_tree(&local_2c0);
    if (local_2c0._M_impl.super__Rb_tree_header._M_node_count != 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Excludes","");
      FormatterBase::get_label((string *)&local_2c0,local_290,&local_258);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_2c0._M_impl._0_8_,
                          local_2c0._M_impl.super__Rb_tree_header._M_header._0_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
      if ((_Base_ptr *)local_2c0._M_impl._0_8_ !=
          &local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)local_2c0._M_impl._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      std::
      _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
      ::_Rb_tree(&local_2c0,&(opt->excludes_)._M_t);
      p_Var2 = &local_2c0._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)local_2c0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
        p_Var8 = local_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          pOVar4 = *(Option **)(p_Var8 + 1);
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
          Option::get_name_abi_cxx11_(&local_288,pOVar4,false,false);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_288._M_dataplus._M_p,local_288._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p);
          }
          p_Var8 = (_Base_ptr)::std::_Rb_tree_increment(p_Var8);
        } while ((_Rb_tree_header *)p_Var8 != p_Var2);
      }
      std::
      _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
      ::~_Rb_tree(&local_2c0);
      __return_storage_ptr__ = local_260;
    }
  }
  else {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(opt->option_text_)._M_dataplus._M_p,(opt->option_text_)._M_string_length);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_option_opts(const Option *opt) const {
    std::stringstream out;

    if(!opt->get_option_text().empty()) {
        out << " " << opt->get_option_text();
    } else {
        if(opt->get_type_size() != 0) {
            if(!opt->get_type_name().empty())
                out << " " << get_label(opt->get_type_name());
            if(!opt->get_default_str().empty())
                out << " [" << opt->get_default_str() << "] ";
            if(opt->get_expected_max() == detail::expected_max_vector_size)
                out << " ...";
            else if(opt->get_expected_min() > 1)
                out << " x " << opt->get_expected();

            if(opt->get_required())
                out << " " << get_label("REQUIRED");
        }
        if(!opt->get_envname().empty())
            out << " (" << get_label("Env") << ":" << opt->get_envname() << ")";
        if(!opt->get_needs().empty()) {
            out << " " << get_label("Needs") << ":";
            for(const Option *op : opt->get_needs())
                out << " " << op->get_name();
        }
        if(!opt->get_excludes().empty()) {
            out << " " << get_label("Excludes") << ":";
            for(const Option *op : opt->get_excludes())
                out << " " << op->get_name();
        }
    }
    return out.str();
}